

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::TestCase::hasTag(TestCase *this,string *tag)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  int iVar3;
  const_iterator cVar4;
  size_type sVar5;
  string lc;
  key_type local_50;
  
  pcVar1 = (tag->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + tag->_M_string_length);
  _Var2._M_p = local_50._M_dataplus._M_p;
  if (local_50._M_string_length != 0) {
    sVar5 = 0;
    do {
      iVar3 = tolower((int)_Var2._M_p[sVar5]);
      _Var2._M_p[sVar5] = (char)iVar3;
      sVar5 = sVar5 + 1;
    } while (local_50._M_string_length != sVar5);
  }
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->super_TestCaseInfo).tags._M_t,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return (_Rb_tree_header *)cVar4._M_node !=
         &(this->super_TestCaseInfo).tags._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool TestCase::hasTag( std::string const& tag ) const {
        return tags.find( toLower( tag ) ) != tags.end();
    }